

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  reference this_00;
  string_type *psVar5;
  string *in_RDI;
  bool first;
  iterator iter;
  iterator *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  byte in_stack_fffffffffffffe47;
  undefined4 in_stack_fffffffffffffe50;
  byte bVar6;
  undefined1 in_stack_fffffffffffffe55;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 uVar7;
  int in_stack_fffffffffffffe64;
  const_iterator in_stack_fffffffffffffe68;
  path *in_stack_fffffffffffffe88;
  bool local_71;
  string *local_8;
  
  bVar1 = empty((path *)0x130f91);
  if (bVar1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      return (path *)in_RDI;
    }
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if (*pcVar3 == '/') {
      return (path *)in_RDI;
    }
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if (*pcVar3 == ':') {
      return (path *)in_RDI;
    }
    std::__cxx11::string::operator+=(in_RDI,'/');
    return (path *)in_RDI;
  }
  bVar2 = is_absolute((path *)0x131019);
  bVar1 = false;
  local_71 = false;
  if (bVar2) {
    root_name(in_stack_fffffffffffffe88);
    bVar1 = true;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe38);
    bVar6 = true;
    if (bVar2) goto LAB_00131117;
    in_stack_fffffffffffffe56 =
         std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                         (char *)in_stack_fffffffffffffe38);
    bVar6 = true;
    if ((bool)in_stack_fffffffffffffe56) goto LAB_00131117;
  }
  local_71 = has_root_name((path *)0x1310ac);
  in_stack_fffffffffffffe55 = false;
  bVar6 = in_stack_fffffffffffffe55;
  if (local_71) {
    root_name(in_stack_fffffffffffffe88);
    root_name(in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe55 =
         filesystem::operator!=
                   ((path *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                    (path *)in_stack_fffffffffffffe38);
    bVar6 = in_stack_fffffffffffffe55;
  }
LAB_00131117:
  uVar7 = bVar6;
  if (local_71 != false) {
    ~path((path *)0x131138);
    ~path((path *)0x131151);
  }
  if (bVar1) {
    ~path((path *)0x13116a);
  }
  if ((bVar6 & 1) == 0) {
    bVar1 = has_root_directory((path *)CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffffe56,
                                                               CONCAT15(in_stack_fffffffffffffe55,
                                                                        CONCAT14(bVar6,
                                                  in_stack_fffffffffffffe50)))));
    if (bVar1) {
      root_name(in_stack_fffffffffffffe88);
      assign<ghc::filesystem::path>
                ((path *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (path *)in_stack_fffffffffffffe38);
      ~path((path *)0x131246);
    }
    else {
      bVar1 = has_root_directory((path *)CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffffe56,
                                                                 CONCAT15(in_stack_fffffffffffffe55,
                                                                          CONCAT14(bVar6,
                                                  in_stack_fffffffffffffe50)))));
      if (((!bVar1) && (bVar1 = is_absolute((path *)0x131286), bVar1)) ||
         (bVar1 = has_filename((path *)in_stack_fffffffffffffe68._M_current), bVar1)) {
        std::__cxx11::string::operator+=(in_RDI,'/');
      }
    }
    begin((path *)in_RDI);
    bVar1 = true;
    bVar2 = has_root_name((path *)0x1312d5);
    if (bVar2) {
      iterator::operator++
                ((iterator *)
                 CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffffe56,
                                         CONCAT15(in_stack_fffffffffffffe55,
                                                  CONCAT14(bVar6,in_stack_fffffffffffffe50)))));
    }
    while( true ) {
      end((path *)in_RDI);
      in_stack_fffffffffffffe47 =
           iterator::operator!=
                     ((iterator *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe38);
      iterator::~iterator((iterator *)0x13133b);
      if ((in_stack_fffffffffffffe47 & 1) == 0) break;
      if (!bVar1) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::length();
          in_stack_fffffffffffffe38 = (iterator *)std::__cxx11::string::operator[]((ulong)in_RDI);
          if (*(char *)&(in_stack_fffffffffffffe38->_first)._M_current == '/') goto LAB_0013139f;
        }
        std::__cxx11::string::operator+=(in_RDI,'/');
      }
LAB_0013139f:
      bVar1 = false;
      iterator::operator++
                ((iterator *)in_stack_fffffffffffffe68._M_current,in_stack_fffffffffffffe64);
      this_00 = iterator::operator*((iterator *)&stack0xfffffffffffffe60);
      psVar5 = native_abi_cxx11_(this_00);
      std::__cxx11::string::operator+=(in_RDI,(string *)psVar5);
      iterator::~iterator((iterator *)0x1313e8);
    }
    check_long_path((path *)in_RDI);
    iterator::~iterator((iterator *)0x131433);
    local_8 = in_RDI;
  }
  else {
    assign<ghc::filesystem::path>
              ((path *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               (path *)in_stack_fffffffffffffe38);
    local_8 = in_RDI;
  }
  return (path *)local_8;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != preferred_separator && _path[_path.length() - 1] != ':') {
            _path += preferred_separator;
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name()._path || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += preferred_separator;
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == preferred_separator)) {
            _path += preferred_separator;
        }
        first = false;
        _path += (*iter++).native();
    }
    check_long_path();
    return *this;
}